

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QMetaProperty * __thiscall
QMetaObject::userProperty(QMetaProperty *__return_storage_ptr__,QMetaObject *this)

{
  int index;
  
  index = propertyCount(this);
  do {
    if (index < 1) {
      (__return_storage_ptr__->menum).mobj = (QMetaObject *)0x0;
      (__return_storage_ptr__->menum).data.d = (uint *)0x0;
      __return_storage_ptr__->mobj = (QMetaObject *)0x0;
      (__return_storage_ptr__->data).d = (uint *)0x0;
      return __return_storage_ptr__;
    }
    index = index + -1;
    (__return_storage_ptr__->menum).mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->menum).data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->data).d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
    property(__return_storage_ptr__,this,index);
  } while ((__return_storage_ptr__->mobj == (QMetaObject *)0x0) ||
          ((*(byte *)((long)(__return_storage_ptr__->data).d + 10) & 0x10) == 0));
  return __return_storage_ptr__;
}

Assistant:

QMetaProperty QMetaObject::userProperty() const
{
    const int propCount = propertyCount();
    for (int i = propCount - 1; i >= 0; --i) {
        const QMetaProperty prop = property(i);
        if (prop.isUser())
            return prop;
    }
    return QMetaProperty();
}